

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::XFBStrideOfEmptyListAndAPITest::getShaderInterface
          (XFBStrideOfEmptyListAndAPITest *this,GLuint param_1,STAGES stage,string *out_interface)

{
  string *out_interface_local;
  STAGES stage_local;
  GLuint param_3_local;
  XFBStrideOfEmptyListAndAPITest *this_local;
  
  if (stage == GEOMETRY) {
    std::__cxx11::string::operator=((string *)out_interface,getShaderInterface::gs);
  }
  else if (stage == FRAGMENT) {
    std::__cxx11::string::operator=((string *)out_interface,getShaderInterface::fs);
  }
  else {
    std::__cxx11::string::operator=((string *)out_interface,"");
  }
  return;
}

Assistant:

void XFBStrideOfEmptyListAndAPITest::getShaderInterface(GLuint /* test_case_index */, Utils::Shader::STAGES stage,
														std::string& out_interface)
{
	static const GLchar* gs = "layout (xfb_buffer = 0, xfb_stride = 64) out;\n"
							  "layout (xfb_buffer = 1, xfb_offset = 0)  out vec4 gs_fs;\n"
							  "\n"
							  "layout(binding    = 0) uniform gs_block {\n"
							  "    vec4 uni_gs;\n"
							  "};\n";
	static const GLchar* fs = "in  vec4 gs_fs;\n"
							  "out vec4 fs_out;\n";

	switch (stage)
	{
	case Utils::Shader::FRAGMENT:
		out_interface = fs;
		break;
	case Utils::Shader::GEOMETRY:
		out_interface = gs;
		break;
	default:
		out_interface = "";
		return;
	}
}